

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi-threads-1.cpp
# Opt level: O0

void __thiscall producer_t::produce(producer_t *this)

{
  redis_accessor_t *tx_buff;
  type *in_R8;
  undefined1 local_78 [48];
  variant<bredis::single_command_t,_std::vector<bredis::single_command_t,_std::allocator<bredis::single_command_t>_>_>
  local_48;
  undefined1 local_28 [8];
  single_command_t cmd_ping;
  producer_t *this_local;
  
  cmd_ping.arguments.
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bredis::single_command_t::single_command_t<char_const(&)[5],void>
            ((single_command_t *)local_28,(char (*) [5])"PING");
  tx_buff = this->redis;
  boost::
  variant<bredis::single_command_t,_std::vector<bredis::single_command_t,_std::allocator<bredis::single_command_t>_>_>
  ::variant<bredis::single_command_t>(&local_48,(single_command_t *)local_28,true);
  local_78._0_8_ = this;
  boost::asio::
  bind_executor<boost::asio::io_context::strand,producer_t::produce()::_lambda(boost::system::error_code_const&,unsigned_long)_1_>
            ((executor_binder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:70:47),_boost::asio::io_context::strand>
              *)(local_78 + 8),(asio *)&this->redis->strand,(strand *)local_78,
             (anon_class_8_1_8991fb9c_for_target_ *)0x0,in_R8);
  bredis::
  Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  async_write<boost::asio::basic_streambuf<std::allocator<char>>,boost::asio::executor_binder<producer_t::produce()::_lambda(boost::system::error_code_const&,unsigned_long)_1_,boost::asio::io_context::strand>>
            ((Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&tx_buff->conn,&tx_buff->tx_buff,&local_48,
             (executor_binder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:70:47),_boost::asio::io_context::strand>
              *)(local_78 + 8));
  boost::asio::
  executor_binder<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/basiliscos[P]cpp-bredis/examples/multi-threads-1.cpp:70:47),_boost::asio::io_context::strand>
  ::~executor_binder((executor_binder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_basiliscos[P]cpp_bredis_examples_multi_threads_1_cpp:70:47),_boost::asio::io_context::strand>
                      *)(local_78 + 8));
  boost::
  variant<bredis::single_command_t,_std::vector<bredis::single_command_t,_std::allocator<bredis::single_command_t>_>_>
  ::~variant(&local_48);
  bredis::single_command_t::~single_command_t((single_command_t *)local_28);
  return;
}

Assistant:

void produce(){
        r::single_command_t cmd_ping{"PING"};
        redis.conn.async_write(
            redis.tx_buff,
            cmd_ping,
            asio::bind_executor(redis.strand, [this](const sys::error_code &ec, std::size_t bytes_transferred){
                if (!ec){
                    auto self = this;
                    self->redis.ping_count++;
                    self->redis.tx_buff.consume(bytes_transferred);
                    self->produce();
                }
            })
        );
    }